

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5_utils.c
# Opt level: O0

void MD5Update(MD5Context *ctx,uchar *buf,uint len)

{
  uint uVar1;
  uint in_EDX;
  void *in_RSI;
  uint *in_RDI;
  uint t;
  uint local_14;
  void *local_10;
  
  uVar1 = in_RDI[4];
  in_RDI[4] = uVar1 + in_EDX;
  if (uVar1 + in_EDX < uVar1) {
    in_RDI[5] = in_RDI[5] + 1;
  }
  local_14 = 0x40 - (uVar1 & 0x3f);
  if (in_EDX < local_14) {
    memcpy((void *)((long)in_RDI + (0x58 - (ulong)local_14)),in_RSI,(ulong)in_EDX);
  }
  else {
    memcpy((void *)((long)in_RDI + (0x58 - (ulong)local_14)),in_RSI,(ulong)local_14);
    byteSwap(in_RDI + 6,0x10);
    MD5Transform(in_RDI,in_RDI + 6);
    local_10 = (void *)((long)in_RSI + (ulong)local_14);
    for (local_14 = in_EDX - local_14; 0x3f < local_14; local_14 = local_14 - 0x40) {
      memcpy(in_RDI + 6,local_10,0x40);
      byteSwap(in_RDI + 6,0x10);
      MD5Transform(in_RDI,in_RDI + 6);
      local_10 = (void *)((long)local_10 + 0x40);
    }
    memcpy(in_RDI + 6,local_10,(ulong)local_14);
  }
  return;
}

Assistant:

void MD5Update(struct MD5Context *ctx, md5byte const *buf, unsigned len) {
  UWORD32 t;

  /* Update byte count */

  t = ctx->bytes[0];

  if ((ctx->bytes[0] = t + len) < t)
    ctx->bytes[1]++; /* Carry from low to high */

  t = 64 - (t & 0x3f); /* Space available in ctx->in (at least 1) */

  if (t > len) {
    memcpy((md5byte *)ctx->in + 64 - t, buf, len);
    return;
  }

  /* First chunk is an odd size */
  memcpy((md5byte *)ctx->in + 64 - t, buf, t);
  byteSwap(ctx->in, 16);
  MD5Transform(ctx->buf, ctx->in);
  buf += t;
  len -= t;

  /* Process data in 64-byte chunks */
  while (len >= 64) {
    memcpy(ctx->in, buf, 64);
    byteSwap(ctx->in, 16);
    MD5Transform(ctx->buf, ctx->in);
    buf += 64;
    len -= 64;
  }

  /* Handle any remaining bytes of data. */
  memcpy(ctx->in, buf, len);
}